

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::EnumDef::EnumDef(EnumDef *this)

{
  EnumDef *this_local;
  
  Definition::Definition(&this->super_Definition);
  this->is_union = false;
  this->uses_multiple_type_instances = false;
  Type::Type(&this->underlying_type,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
  SymbolTable<flatbuffers::EnumVal>::SymbolTable(&this->vals);
  return;
}

Assistant:

EnumDef() : is_union(false), uses_multiple_type_instances(false) {}